

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O0

string * __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
::make_file_name_abi_cxx11_
          (string *__return_storage_ptr__,
          basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
          *this,uint index)

{
  ostream *this_00;
  ostringstream local_198 [8];
  ostringstream str;
  uint index_local;
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)(this + 0x58));
  if (index != 0) {
    this_00 = std::operator<<((ostream *)local_198,'.');
    std::ostream::operator<<(this_00,index);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string basic_rotating_log<StreamTraits, FileSystemTraits>::make_file_name (
        unsigned const index) const {
        std::ostringstream str;
        str << base_name_;
        if (index > 0) {
            str << '.' << index;
        }
        return str.str ();
    }